

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec::GpuCounterDescriptor_GpuCounterSpec
          (GpuCounterDescriptor_GpuCounterSpec *this,GpuCounterDescriptor_GpuCounterSpec *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  double dVar4;
  pointer pGVar5;
  pointer pGVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GpuCounterDescriptor_GpuCounterSpec_003a0f58;
  this->counter_id_ = param_2->counter_id_;
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->name_)._M_dataplus._M_p;
  paVar7 = &(param_2->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar3 = *(undefined8 *)((long)&(param_2->name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar3;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar2;
    (this->name_).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = (param_2->name_)._M_string_length;
  (param_2->name_)._M_dataplus._M_p = (pointer)paVar7;
  (param_2->name_)._M_string_length = 0;
  (param_2->name_).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->description_).field_2;
  (this->description_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->description_)._M_dataplus._M_p;
  paVar7 = &(param_2->description_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar3 = *(undefined8 *)((long)&(param_2->description_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->description_).field_2 + 8) = uVar3;
  }
  else {
    (this->description_)._M_dataplus._M_p = pcVar2;
    (this->description_).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->description_)._M_string_length = (param_2->description_)._M_string_length;
  (param_2->description_)._M_dataplus._M_p = (pointer)paVar7;
  (param_2->description_)._M_string_length = 0;
  (param_2->description_).field_2._M_local_buf[0] = '\0';
  dVar4 = param_2->double_peak_value_;
  this->int_peak_value_ = param_2->int_peak_value_;
  this->double_peak_value_ = dVar4;
  pGVar5 = (param_2->numerator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_2->numerator_units_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar5;
  (this->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->numerator_units_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pGVar5 = (param_2->denominator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_2->denominator_units_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar5;
  (this->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->denominator_units_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->select_by_default_ = param_2->select_by_default_;
  pGVar6 = (param_2->groups_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_2->groups_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar6;
  (this->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->groups_).
       super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->unknown_fields_)._M_dataplus._M_p;
  paVar7 = &(param_2->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar3 = *(undefined8 *)((long)&(param_2->unknown_fields_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->unknown_fields_).field_2 + 8) = uVar3;
  }
  else {
    (this->unknown_fields_)._M_dataplus._M_p = pcVar2;
    (this->unknown_fields_).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->unknown_fields_)._M_string_length = (param_2->unknown_fields_)._M_string_length;
  (param_2->unknown_fields_)._M_dataplus._M_p = (pointer)paVar7;
  (param_2->unknown_fields_)._M_string_length = 0;
  (param_2->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_2->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

GpuCounterDescriptor_GpuCounterSpec::GpuCounterDescriptor_GpuCounterSpec(GpuCounterDescriptor_GpuCounterSpec&&) noexcept = default;